

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImRect GetResizeBorderRect(ImGuiWindow *window,int border_n,float perp_padding,float thickness)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImRect IVar7;
  
  IVar7 = ImGuiWindow::Rect(window);
  fVar2 = IVar7.Max.x;
  fVar3 = IVar7.Max.y;
  if ((thickness == 0.0) && (!NAN(thickness))) {
    fVar2 = fVar2 + -1.0;
    fVar3 = fVar3 + -1.0;
  }
  fVar4 = IVar7.Min.x;
  fVar1 = IVar7.Min.y;
  switch(border_n) {
  case 0:
    fVar4 = fVar4 + perp_padding;
    fVar5 = fVar1 - thickness;
    fVar6 = fVar2 - perp_padding;
    fVar3 = fVar1 + thickness;
    break;
  case 1:
    goto LAB_00123caf;
  case 2:
    fVar4 = fVar4 + perp_padding;
    fVar5 = fVar3 - thickness;
    fVar6 = fVar2 - perp_padding;
    fVar3 = fVar3 + thickness;
    break;
  case 3:
    fVar2 = fVar4;
LAB_00123caf:
    fVar5 = fVar1 + perp_padding;
    fVar3 = fVar3 - perp_padding;
    fVar6 = thickness + fVar2;
    fVar4 = fVar2 - thickness;
    break;
  default:
    fVar6 = -3.4028235e+38;
    fVar3 = -3.4028235e+38;
    fVar4 = 3.4028235e+38;
    fVar5 = 3.4028235e+38;
  }
  IVar7.Min.y = fVar5;
  IVar7.Min.x = fVar4;
  IVar7.Max.y = fVar3;
  IVar7.Max.x = fVar6;
  return IVar7;
}

Assistant:

static ImRect GetResizeBorderRect(ImGuiWindow* window, int border_n, float perp_padding, float thickness)
{
    ImRect rect = window->Rect();
    if (thickness == 0.0f) rect.Max -= ImVec2(1,1);
    if (border_n == 0) return ImRect(rect.Min.x + perp_padding, rect.Min.y - thickness,    rect.Max.x - perp_padding, rect.Min.y + thickness);
    if (border_n == 1) return ImRect(rect.Max.x - thickness,    rect.Min.y + perp_padding, rect.Max.x + thickness,    rect.Max.y - perp_padding);
    if (border_n == 2) return ImRect(rect.Min.x + perp_padding, rect.Max.y - thickness,    rect.Max.x - perp_padding, rect.Max.y + thickness);
    if (border_n == 3) return ImRect(rect.Min.x - thickness,    rect.Min.y + perp_padding, rect.Min.x + thickness,    rect.Max.y - perp_padding);
    IM_ASSERT(0);
    return ImRect();
}